

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::~XmlSerializer(XmlSerializer *this)

{
  pointer ppaVar1;
  pointer ppaVar2;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->mMatId2MatArray)._M_t);
  ppaVar1 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppaVar1 != (pointer)0x0) {
    operator_delete(ppaVar1,(long)(this->mMatArray).
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar1)
    ;
  }
  ppaVar2 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar2 != (pointer)0x0) {
    operator_delete(ppaVar2,(long)(this->mMeshes).
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar2);
  }
  std::
  vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ::~vector(&this->mMetaData);
  return;
}

Assistant:

~XmlSerializer() {
        // empty
    }